

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int rngStreamTest(char *filename,char *resul,char *errr,int options)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *__s;
  xmlTextReaderPtr reader_00;
  int disable_err;
  xmlTextReaderPtr reader;
  ulong uStack_898;
  char count;
  size_t i;
  glob_t globbuf;
  char err [500];
  char local_648 [8];
  char result [500];
  char local_448 [8];
  char prefix [500];
  char local_248 [8];
  char pattern [500];
  int ret;
  int len;
  int res;
  char *instance;
  char *base2;
  char *base;
  int options_local;
  char *errr_local;
  char *resul_local;
  char *filename_local;
  
  pcVar4 = baseFilename(filename);
  ret = 0;
  bVar2 = false;
  sVar5 = strlen(pcVar4);
  pattern._496_4_ = (undefined4)sVar5;
  if (((int)pattern._496_4_ < 500) && (4 < (int)pattern._496_4_)) {
    pattern._496_4_ = pattern._496_4_ + -4;
    memcpy(local_448,pcVar4,(long)(int)pattern._496_4_);
    local_448[(int)pattern._496_4_] = '\0';
    iVar3 = strcmp(local_448,"tutor10_1");
    if ((((iVar3 == 0) || (iVar3 = strcmp(local_448,"tutor10_2"), iVar3 == 0)) ||
        (iVar3 = strcmp(local_448,"tutor3_2"), iVar3 == 0)) ||
       ((iVar3 = strcmp(local_448,"307377"), iVar3 == 0 ||
        (iVar3 = strcmp(local_448,"tutor8_2"), iVar3 == 0)))) {
      bVar2 = true;
    }
    iVar3 = snprintf(local_248,499,"./test/relaxng/%s_?.xml",local_448);
    if (0x1f2 < iVar3) {
      pattern[0x1eb] = '\0';
    }
    globbuf.gl_pathv = (char **)0x0;
    glob64(local_248,8,(__errfunc *)0x0,(glob64_t *)&i);
    for (uStack_898 = 0; uStack_898 < i; uStack_898 = uStack_898 + 1) {
      testErrorsSize = 0;
      testErrors[0] = '\0';
      pcVar4 = *(char **)(globbuf.gl_pathc + uStack_898 * 8);
      __s = baseFilename(pcVar4);
      sVar5 = strlen(__s);
      pattern._496_4_ = (undefined4)sVar5;
      if (((int)pattern._496_4_ < 7) || (__s[pattern._496_4_ + -6] != '_')) {
        fprintf(_stderr,"don\'t know how to process %s\n",pcVar4);
      }
      else {
        cVar1 = __s[pattern._496_4_ + -5];
        pattern._492_4_ =
             snprintf(local_648,499,"result/relaxng/%s_%c",local_448,(ulong)(uint)(int)cVar1);
        if (0x1f2 < (int)pattern._492_4_) {
          result[0x1eb] = '\0';
        }
        pattern._492_4_ =
             snprintf((char *)&globbuf.gl_stat,499,"result/relaxng/%s_%c.err",local_448,
                      (ulong)(uint)(int)cVar1);
        reader_00 = (xmlTextReaderPtr)xmlReaderForFile(pcVar4,0,options);
        if (reader_00 == (xmlTextReaderPtr)0x0) {
          fprintf(_stderr,"Failed to build reader for %s\n",pcVar4);
        }
        if (bVar2) {
          pattern._492_4_ =
               streamProcessTest(pcVar4,local_648,(char *)0x0,reader_00,filename,options);
        }
        else {
          pattern._492_4_ =
               streamProcessTest(pcVar4,local_648,(char *)&globbuf.gl_stat,reader_00,filename,
                                 options);
        }
        xmlFreeTextReader(reader_00);
        if (pattern._492_4_ != 0) {
          fprintf(_stderr,"instance %s failed\n",pcVar4);
          ret._0_1_ = pattern[0x1ec];
          ret._1_1_ = pattern[0x1ed];
          ret._2_1_ = pattern[0x1ee];
          ret._3_1_ = pattern[0x1ef];
        }
      }
    }
    globfree64((glob64_t *)&i);
    filename_local._4_4_ = ret;
  }
  else {
    fprintf(_stderr,"len(base) == %d !\n",sVar5 & 0xffffffff);
    filename_local._4_4_ = -1;
  }
  return filename_local._4_4_;
}

Assistant:

static int
rngStreamTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    int res = 0, len, ret;
    char pattern[500];
    char prefix[500];
    char result[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;
    xmlTextReaderPtr reader;
    int disable_err = 0;

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
	fprintf(stderr, "len(base) == %d !\n", len);
	return(-1);
    }
    len -= 4; /* remove trailing .rng */
    memcpy(prefix, base, len);
    prefix[len] = 0;

    /*
     * strictly unifying the error messages is nearly impossible this
     * hack is also done in the Makefile
     */
    if ((!strcmp(prefix, "tutor10_1")) || (!strcmp(prefix, "tutor10_2")) ||
        (!strcmp(prefix, "tutor3_2")) || (!strcmp(prefix, "307377")) ||
        (!strcmp(prefix, "tutor8_2")))
	disable_err = 1;

    if (snprintf(pattern, 499, "./test/relaxng/%s_?.xml", prefix) >= 499)
        pattern[499] = 0;

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = 0;
	testErrors[0] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(result, 499, "result/relaxng/%s_%c",
		     prefix, count);
            if (ret >= 499)
	        result[499] = 0;
	    ret = snprintf(err, 499, "result/relaxng/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}
	reader = xmlReaderForFile(instance, NULL, options);
	if (reader == NULL) {
	    fprintf(stderr, "Failed to build reader for %s\n", instance);
	}
	if (disable_err == 1)
	    ret = streamProcessTest(instance, result, NULL, reader, filename,
	                            options);
	else
	    ret = streamProcessTest(instance, result, err, reader, filename,
	                            options);
	xmlFreeTextReader(reader);
	if (ret != 0) {
	    fprintf(stderr, "instance %s failed\n", instance);
	    res = ret;
	}
    }
    globfree(&globbuf);

    return(res);
}